

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_matcher.hpp
# Opt level: O0

AssertionResult * __thiscall
iutest::detail::SizeIsMatcher<unsigned_int>::operator()
          (AssertionResult *__return_storage_ptr__,SizeIsMatcher<unsigned_int> *this,
          int (*actual) [3])

{
  bool bVar1;
  AssertionResult *rhs;
  string local_68;
  AssertionResult local_48;
  int (*local_20) [3];
  int (*actual_local) [3];
  SizeIsMatcher<unsigned_int> *this_local;
  
  local_20 = actual;
  actual_local = (int (*) [3])this;
  this_local = (SizeIsMatcher<unsigned_int> *)__return_storage_ptr__;
  bVar1 = Check<int,3ul>(this,actual);
  if (bVar1) {
    AssertionSuccess();
  }
  else {
    AssertionFailure();
    WhichIs_abi_cxx11_(&local_68,this);
    rhs = AssertionResult::operator<<(&local_48,&local_68);
    AssertionResult::AssertionResult(__return_storage_ptr__,rhs);
    std::__cxx11::string::~string((string *)&local_68);
    AssertionResult::~AssertionResult(&local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

IUTEST_COND_LIKELY( Check(actual) )
        {
            return AssertionSuccess();
        }